

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

ostream * smf::operator<<(ostream *out,MidiMessage *message)

{
  uchar uVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  int i;
  long lVar6;
  
  for (lVar6 = 0;
      puVar2 = (message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar6 < *(int *)&(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (int)puVar2; lVar6 = lVar6 + 1) {
    uVar1 = puVar2[lVar6];
    if ((char)uVar1 < '\0') {
      poVar5 = std::operator<<(out,"0x");
      lVar3 = *(long *)poVar5;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(poVar5 + lVar4 + 0x18) = *(uint *)(poVar5 + lVar4 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x10) = 2;
      poVar5 = std::operator<<(poVar5,0x30);
      std::ostream::operator<<
                (poVar5,(uint)(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                              .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar6]);
      lVar3 = *(long *)out;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(out + lVar4 + 0x18) = *(uint *)(out + lVar4 + 0x18) & 0xffffffb5 | 2;
      *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 0x10) = 0;
      std::operator<<(out,0x20);
    }
    else {
      std::ostream::operator<<(out,(int)(char)uVar1);
    }
    if (lVar6 < (int)(~*(uint *)&(message->
                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                     *(int *)&(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                              .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish)) {
      std::operator<<(out,' ');
    }
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, MidiMessage& message) {
	for (int i=0; i<(int)message.size(); i++) {
		if (message[i] >= 0x80) {
			out << "0x" << std::hex << std::setw(2) << std::setfill('0') << (int)message[i];
			out << std::dec << std::setw(0) << std::setfill(' ');
		} else {
			out << (int)message[i];
		}
		if (i<(int)message.size() - 1) {
			out << ' ';
		}
	}
	return out;
}